

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

void __thiscall
CustomHeaderOATC::CustomHeaderOATC
          (CustomHeaderOATC *this,vector<CodeGenerator_*,_std::allocator<CodeGenerator_*>_> *gens,
          ProgramContext *program)

{
  ushort uVar1;
  pointer pCVar2;
  Command *command;
  bool bVar3;
  uint uVar4;
  char *msg;
  pointer v;
  pointer ppCVar5;
  unsigned_short local_58;
  anon_class_1_0_00000001 local_55;
  char local_54;
  vector<std::pair<Command_const*,unsigned_short>,std::allocator<std::pair<Command_const*,unsigned_short>>>
  *local_50;
  ProgramContext *local_48;
  pointer local_40;
  Command *local_38;
  
  local_50 = (vector<std::pair<Command_const*,unsigned_short>,std::allocator<std::pair<Command_const*,unsigned_short>>>
              *)&this->ordinal_commands;
  (this->ordinal_commands).
  super__Vector_base<std::pair<const_Command_*,_unsigned_short>,_std::allocator<std::pair<const_Command_*,_unsigned_short>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ordinal_commands).
  super__Vector_base<std::pair<const_Command_*,_unsigned_short>,_std::allocator<std::pair<const_Command_*,_unsigned_short>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ordinal_commands).
  super__Vector_base<std::pair<const_Command_*,_unsigned_short>,_std::allocator<std::pair<const_Command_*,_unsigned_short>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->starting_opcode = 0x1000;
  ppCVar5 = (gens->super__Vector_base<CodeGenerator_*,_std::allocator<CodeGenerator_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_40 = (gens->super__Vector_base<CodeGenerator_*,_std::allocator<CodeGenerator_*>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  local_48 = program;
  if (ppCVar5 == local_40) {
    uVar4 = 0x1000;
  }
  else {
    do {
      pCVar2 = ((*ppCVar5)->compiled).
               super__Vector_base<CompiledData,_std::allocator<CompiledData>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (v = ((*ppCVar5)->compiled).
               super__Vector_base<CompiledData,_std::allocator<CompiledData>_>._M_impl.
               super__Vector_impl_data._M_start; v != pCVar2; v = v + 1) {
        bVar3 = eggs::variants::detail::
                apply<bool,is<CompiledCommand,eggs::variants::variant<CompiledLabelDef,CompiledCommand,CompiledHex>>(eggs::variants::variant<CompiledLabelDef,CompiledCommand,CompiledHex>const&)::_lambda(auto:1_const&)_1_,eggs::variants::detail::_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,CompiledLabelDef,CompiledCommand,CompiledHex>,false,false>const&>
                          (&local_55,
                           (_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_CompiledLabelDef,_CompiledCommand,_CompiledHex>,_false,_false>
                            *)v);
        if (bVar3) {
          if (((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_CompiledLabelDef,_CompiledCommand,_CompiledHex>,_true,_true>
                *)&(v->data)._storage)->_which != 2) {
            eggs::variants::detail::throw_bad_variant_access<CompiledCommand_const&>();
          }
          command = *(Command **)
                     ((long)&(((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_CompiledLabelDef,_CompiledCommand,_CompiledHex>,_true,_true>
                                *)&(v->data)._storage)->
                             super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_CompiledLabelDef,_CompiledCommand,_CompiledHex>,_false>
                             ).field_0 + 8);
          if ((command->hash).super_OptionalBase<unsigned_int>.init_ == true) {
            find_opcode(this,command);
            if (local_54 == '\0') {
              local_58 = (unsigned_short)
                         ((uint)(*(int *)&(this->ordinal_commands).
                                          super__Vector_base<std::pair<const_Command_*,_unsigned_short>,_std::allocator<std::pair<const_Command_*,_unsigned_short>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                *(int *)&(this->ordinal_commands).
                                         super__Vector_base<std::pair<const_Command_*,_unsigned_short>,_std::allocator<std::pair<const_Command_*,_unsigned_short>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 4);
              local_38 = command;
              std::
              vector<std::pair<Command_const*,unsigned_short>,std::allocator<std::pair<Command_const*,unsigned_short>>>
              ::emplace_back<Command_const*,unsigned_short>(local_50,&local_38,&local_58);
            }
          }
          else if (((command->id).super_OptionalBase<unsigned_short>.init_ == true) &&
                  (uVar1 = (command->id).super_OptionalBase<unsigned_short>.storage_.value_,
                  this->starting_opcode < uVar1)) {
            this->starting_opcode = uVar1 + 1;
          }
        }
      }
      ppCVar5 = ppCVar5 + 1;
    } while (ppCVar5 != local_40);
    uVar4 = (uint)this->starting_opcode;
    if (0x7ffe < this->starting_opcode) {
      msg = "failed to determine OATC starting opcode";
      goto LAB_00155672;
    }
  }
  if ((ulong)((long)(this->ordinal_commands).
                    super__Vector_base<std::pair<const_Command_*,_unsigned_short>,_std::allocator<std::pair<const_Command_*,_unsigned_short>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->ordinal_commands).
                    super__Vector_base<std::pair<const_Command_*,_unsigned_short>,_std::allocator<std::pair<const_Command_*,_unsigned_short>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) < (ulong)(uVar4 ^ 0x7fff)) {
    return;
  }
  msg = "too many custom commands in a single script";
LAB_00155672:
  ProgramContext::fatal_error<tag_nocontext_t>(local_48,(tag_nocontext_t *)&nocontext,msg);
}

Assistant:

CustomHeaderOATC::CustomHeaderOATC(const std::vector<CodeGenerator*>& gens, ProgramContext& program)
{
    this->starting_opcode = 0x1000;

    for(auto& pgen : gens)
    {
        for(auto& op : pgen->ir())
        {
            if(is<CompiledCommand>(op.data))
            {
                auto& ccmd = get<CompiledCommand>(op.data);
                if(ccmd.command.hash)
                {
                    if(!this->find_opcode(ccmd.command))
                    {
                        this->ordinal_commands.emplace_back(&ccmd.command, (uint16_t) this->ordinal_commands.size());
                    }
                }
                else if(ccmd.command.id && this->starting_opcode < *ccmd.command.id)
                {
                    this->starting_opcode = *ccmd.command.id + 1;
                }
            }
        }
    }

    if(this->starting_opcode >= 0x7FFF)
        program.fatal_error(nocontext, "failed to determine OATC starting opcode");

    if(this->ordinal_commands.size() >= (0x7FFFu - this->starting_opcode))
        program.fatal_error(nocontext, "too many custom commands in a single script");
}